

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.cpp
# Opt level: O1

Number * __thiscall LiteScript::Number::operator-=(Number *this,Number *number)

{
  float fVar1;
  float fVar2;
  float fVar3;
  
  if (this->numeric_type == '\0' && number->numeric_type == '\0') {
    (this->value).integer = (this->value).integer - (number->value).integer;
  }
  else {
    fVar1 = (this->value).flotting;
    if (this->numeric_type == '\0') {
      fVar1 = (float)(int)fVar1;
    }
    fVar3 = (number->value).flotting;
    if (number->numeric_type == '\0') {
      fVar3 = (float)(int)fVar3;
    }
    fVar1 = fVar1 - fVar3;
    fVar2 = roundf(fVar1);
    fVar3 = (float)(int)fVar1;
    if (fVar2 != fVar1) {
      fVar3 = fVar1;
    }
    if (NAN(fVar2) || NAN(fVar1)) {
      fVar3 = fVar1;
    }
    this->numeric_type = fVar2 != fVar1;
    (this->value).integer = (int)fVar3;
  }
  return this;
}

Assistant:

LiteScript::Number& LiteScript::Number::operator-=(const LiteScript::Number& number) {
    if (this->numeric_type == 0 && number.numeric_type == 0)
        this->value.integer -= number.value.integer;
    else
        *this = (float)*this - (float)number;
    return *this;
}